

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

ValueType * __thiscall
HighsHashTable<int,_double>::operator[](HighsHashTable<int,_double> *this,KeyType_conflict *key)

{
  HighsHashTableEntry<int,_double> *pHVar1;
  byte bVar2;
  uchar uVar3;
  _Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false> _Var4;
  uchar *puVar5;
  undefined8 uVar6;
  double dVar7;
  undefined8 uVar8;
  bool bVar9;
  ValueType *pVVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  uchar local_51;
  ulong local_50;
  HighsHashTableEntry<int,_double> local_48;
  ulong local_38;
  ulong local_30;
  HighsHashTableEntry<int,_double> local_28;
  
  _Var4._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>._M_head_impl;
  bVar9 = findPosition(this,key,&local_51,&local_30,&local_38,&local_50);
  if (bVar9) {
    return (double *)((long)(_Var4._M_head_impl + local_50) + 8);
  }
  uVar11 = this->tableSizeMask;
  if ((this->numElements == uVar11 * 7 + 7 >> 3) || (local_50 == local_38)) {
    growTable(this);
  }
  else {
    uVar8 = _Var4._M_head_impl + local_50;
    local_48.key_ = *key;
    local_48.value_ = 0.0;
    this->numElements = this->numElements + 1;
    uVar12 = local_38;
    do {
      puVar5 = (this->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      bVar2 = puVar5[local_50];
      if (-1 < (char)bVar2) {
        puVar5[local_50] = local_51;
        pHVar1 = _Var4._M_head_impl + local_50;
        pHVar1->key_ = local_48.key_;
        *(undefined4 *)&pHVar1->field_0x4 = local_48._4_4_;
        pHVar1->value_ = local_48.value_;
        return (double *)(uVar8 + 8);
      }
      uVar13 = (ulong)((int)local_50 - (uint)bVar2 & 0x7f);
      if (uVar13 < (local_50 - local_30 & uVar11)) {
        local_28.key_ = local_48.key_;
        local_28._4_4_ = local_48._4_4_;
        local_28.value_ = local_48.value_;
        pHVar1 = _Var4._M_head_impl + local_50;
        uVar6._0_4_ = pHVar1->key_;
        uVar6._4_4_ = *(undefined4 *)&pHVar1->field_0x4;
        dVar7 = pHVar1->value_;
        pHVar1 = _Var4._M_head_impl + local_50;
        pHVar1->key_ = local_48.key_;
        *(undefined4 *)&pHVar1->field_0x4 = local_48._4_4_;
        pHVar1->value_ = local_48.value_;
        puVar5 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        uVar3 = puVar5[local_50];
        puVar5[local_50] = local_51;
        uVar11 = this->tableSizeMask;
        local_30 = local_50 - uVar13 & uVar11;
        uVar12 = local_30 + 0x7f & uVar11;
        local_51 = uVar3;
        local_48._0_8_ = uVar6;
        local_48.value_ = dVar7;
        local_38 = uVar12;
      }
      local_50 = local_50 + 1 & uVar11;
    } while (local_50 != uVar12);
    growTable(this);
    HighsHashTable<int,double>::insert<HighsHashTableEntry<int,double>>
              ((HighsHashTable<int,double> *)this,&local_48);
  }
  pVVar10 = operator[](this,key);
  return pVVar10;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }